

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteDbRelease(unqlite *pDb)

{
  unqlite_vm *puVar1;
  jx9 *pEngine;
  jx9 *pjVar2;
  jx9 *pjVar3;
  int iVar4;
  int iVar5;
  Pager *pPVar6;
  unqlite_vm *pVm;
  
  pPVar6 = (pDb->sDB).pPager;
  if ((pDb->iFlags & 1) == 0) {
    iVar4 = unqlitePagerCommit(pPVar6);
    if (iVar4 == 0) {
      iVar4 = 0;
      goto LAB_0010b770;
    }
    pPVar6 = (pDb->sDB).pPager;
  }
  iVar4 = unqlitePagerRollback(pPVar6,0);
LAB_0010b770:
  pPVar6 = (pDb->sDB).pPager;
  pager_release_kv_engine(pPVar6);
  if (((pPVar6->iOpenFlags & 0x100) != 0) && (pPVar6->pMmap != (void *)0x0)) {
    munmap(pPVar6->pMmap,pPVar6->dbByteSize);
  }
  if ((pPVar6->is_mem == 0) && (-1 < pPVar6->iState)) {
    pager_unlock_db(pPVar6,0);
    unqliteOsCloseFree(pPVar6->pAllocator,pPVar6->pfd);
  }
  if (pPVar6->pVec != (Bitvec *)0x0) {
    unqliteBitvecDestroy(pPVar6->pVec);
    pPVar6->pVec = (Bitvec *)0x0;
  }
  iVar5 = pDb->iVm;
  pVm = pDb->pVms;
  while (0 < iVar5) {
    puVar1 = pVm->pNext;
    unqliteVmRelease(pVm);
    iVar5 = pDb->iVm + -1;
    pDb->iVm = iVar5;
    pVm = puVar1;
  }
  pEngine = (pDb->sDB).pJx9;
  if ((pEngine != (jx9 *)0x0) && (pEngine->nMagic == 0xf874bcd7)) {
    EngineRelease(pEngine);
    if (sJx9MPGlobal.pEngines == pEngine) {
      sJx9MPGlobal.pEngines = (sJx9MPGlobal.pEngines)->pNext;
    }
    pjVar2 = pEngine->pNext;
    pjVar3 = pEngine->pPrev;
    if (pjVar3 != (jx9 *)0x0) {
      pjVar3->pNext = pjVar2;
    }
    if (pjVar2 != (jx9 *)0x0) {
      pjVar2->pPrev = pjVar3;
    }
    sJx9MPGlobal.nEngine = sJx9MPGlobal.nEngine + -1;
    SyMemBackendPoolFree(&sJx9MPGlobal.sAllocator,pEngine);
  }
  pDb->nMagic = 0x7250;
  SyMemBackendRelease(&pDb->sMem);
  return iVar4;
}

Assistant:

static int unqliteDbRelease(unqlite *pDb)
{
	unqlite_db *pStore = &pDb->sDB;
	unqlite_vm *pVm,*pNext;
	int rc = UNQLITE_OK;
	if( (pDb->iFlags & UNQLITE_FL_DISABLE_AUTO_COMMIT) == 0 ){
		/* Commit any outstanding transaction */
		rc = unqlitePagerCommit(pStore->pPager);
		if( rc != UNQLITE_OK ){
			/* Rollback the transaction */
			rc = unqlitePagerRollback(pStore->pPager,FALSE);
		}
	}else{
		/* Rollback any outstanding transaction */
		rc = unqlitePagerRollback(pStore->pPager,FALSE);
	}
	/* Close the pager */
	unqlitePagerClose(pStore->pPager);
	/* Release any active VM's */
	pVm = pDb->pVms;
	for(;;){
		if( pDb->iVm < 1 ){
			break;
		}
		/* Point to the next entry */
		pNext = pVm->pNext;
		unqliteVmRelease(pVm);
		pVm = pNext;
		pDb->iVm--;
	}
	/* Release the Jx9 handle */
	jx9_release(pStore->pJx9);
	/* Set a dummy magic number */
	pDb->nMagic = 0x7250;
	/* Release the whole memory subsystem */
	SyMemBackendRelease(&pDb->sMem);
	/* Commit or rollback result */
	return rc;
}